

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall Js::RootObjectVariablesWalker::PopulateMembers(RootObjectVariablesWalker *this)

{
  code *pcVar1;
  anon_class_16_2_e988e071 fn;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ArenaAllocator *alloc;
  undefined4 *puVar4;
  RootObjectBase *this_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  int count;
  RootObjectBase *object;
  ArenaAllocator *arena;
  ScriptContext *scriptContext;
  RootObjectVariablesWalker *this_local;
  
  if (((this->super_ObjectVariablesWalker).super_VariableWalkerBase.pMembersList ==
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance != (Var)0x0)) {
    scriptContext = (ScriptContext *)this;
    iVar3 = (*((this->super_ObjectVariablesWalker).super_VariableWalkerBase.pFrame)->
              _vptr_DiagStackFrame[10])();
    arena = (ArenaAllocator *)CONCAT44(extraout_var,iVar3);
    alloc = GetArenaFromContext((ScriptContext *)arena);
    bVar2 = VarIs<Js::RootObjectBase>
                      ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x37f,"(Js::VarIs<Js::RootObjectBase>(instance))",
                                  "Js::VarIs<Js::RootObjectBase>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = VarTo<Js::RootObjectBase>
                        ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance);
    iVar3 = (*(this_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
    pLVar5 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,iVar3);
    (this->super_ObjectVariablesWalker).super_VariableWalkerBase.pMembersList = pLVar5;
    fn.this = this;
    fn.scriptContext = (ScriptContext **)&arena;
    RootObjectBase::MapLetConstGlobals<Js::RootObjectVariablesWalker::PopulateMembers()::__0>
              (this_00,fn);
    ObjectVariablesWalker::AddObjectProperties
              (&this->super_ObjectVariablesWalker,iVar3,(RecyclableObject *)this_00);
  }
  return;
}

Assistant:

void RootObjectVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr && instance != nullptr)
        {
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            Assert(Js::VarIs<Js::RootObjectBase>(instance));
            Js::RootObjectBase* object = Js::VarTo<Js::RootObjectBase>(instance);

            int count = object->GetPropertyCount();
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena, count);

            // Add let/const globals first so that they take precedence over the global properties.  Then
            // VariableWalkerBase::FindPropertyAddress will correctly find let/const globals that shadow
            // global properties of the same name.
            object->MapLetConstGlobals([&](const PropertyRecord* propertyRecord, Var value, bool isConst) {
                if (!scriptContext->IsUndeclBlockVar(value))
                {
                    // Let/const are always enumerable and valid
                    DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(propertyRecord->GetPropertyId(), value, isConst, false /*isInDeadZone*/);
                    pMembersList->Add(info);
                }
            });

            AddObjectProperties(count, object);
        }
    }